

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O3

void compaction_failure_hangs_rollback_test(void)

{
  fdb_status fVar1;
  anomalous_callbacks *cbs;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  char *__format;
  long lVar6;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile_comp;
  fail_ctx_t fail_ctx;
  char metabuf [32];
  char keybuf [32];
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [128];
  fdb_config fconfig;
  fdb_file_handle *local_bb0;
  fdb_kvs_handle *local_ba8;
  fdb_file_handle *local_ba0;
  ulong local_b98;
  undefined4 local_b90;
  char local_b88 [32];
  char local_b68 [40];
  timeval local_b40;
  fdb_kvs_config local_b30;
  char local_b18 [136];
  fdb_config local_a90;
  fdb_doc *apfStack_998 [301];
  
  gettimeofday(&local_b40,(__timezone_ptr_t)0x0);
  cbs = get_default_anon_cbs();
  local_b90 = 0;
  local_b98 = 0;
  cbs->fsync_cb = fsync_failure_cb;
  system("rm -rf  anomaly_test* > errorlog.txt");
  filemgr_ops_anomalous_init(cbs,&local_b98);
  local_b90 = 3;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_a90.flags = 1;
  local_a90.purging_interval = 0;
  fdb_open(&local_bb0,"anomaly_test2",&local_a90);
  fdb_kvs_open_default(local_bb0,&local_ba8,&local_b30);
  lVar6 = 0;
  uVar5 = 0;
  do {
    sprintf(local_b68,"key%d",uVar5 & 0xffffffff);
    sprintf(local_b88,"meta%d",uVar5 & 0xffffffff);
    sprintf(local_b18,"body%d",uVar5 & 0xffffffff);
    sVar2 = strlen(local_b68);
    sVar3 = strlen(local_b88);
    sVar4 = strlen(local_b18);
    fdb_doc_create((fdb_doc **)((long)apfStack_998 + lVar6),local_b68,sVar2 + 1,local_b88,sVar3 + 1,
                   local_b18,sVar4 + 1);
    fVar1 = fdb_set(local_ba8,apfStack_998[uVar5]);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      compaction_failure_hangs_rollback_test();
LAB_00108b5b:
      compaction_failure_hangs_rollback_test();
      goto LAB_00108b60;
    }
    if (uVar5 == 0x96) {
      fVar1 = fdb_commit(local_bb0,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108b5b;
    }
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 8;
  } while (uVar5 != 300);
  fVar1 = fdb_commit(local_bb0,'\0');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_open(&local_ba0,"anomaly_test2",&local_a90);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00108b65;
    fVar1 = fdb_compact(local_ba0,"anomaly_test3");
    if (fVar1 != FDB_RESULT_FSYNC_FAIL) goto LAB_00108b6a;
    local_b90 = 99999;
    fVar1 = fdb_close(local_ba0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_rollback(&local_ba8,0x97);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_close(local_bb0);
        lVar6 = 0;
        do {
          fdb_doc_free(apfStack_998[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 300);
        fdb_shutdown();
        sprintf(local_b18,"compaction failure hangs rollback test :%d failures out of %d commits",
                local_b98 & 0xffffffff,local_b98 >> 0x20);
        __format = "%s PASSED\n";
        if (compaction_failure_hangs_rollback_test()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,local_b18);
        return;
      }
      goto LAB_00108b74;
    }
  }
  else {
LAB_00108b60:
    compaction_failure_hangs_rollback_test();
LAB_00108b65:
    compaction_failure_hangs_rollback_test();
LAB_00108b6a:
    compaction_failure_hangs_rollback_test();
  }
  compaction_failure_hangs_rollback_test();
LAB_00108b74:
  compaction_failure_hangs_rollback_test();
  write_failure_test();
  read_failure_test();
  handle_busy_test();
  read_old_file();
  corrupted_header_correct_superblock_test();
  compaction_failure_hangs_rollback_test();
  return;
}

Assistant:

void compaction_failure_hangs_rollback_test()
{
    TEST_INIT();

    int i, r;
    int n=300; // n: # prefixes, m: # postfixes
    fdb_file_handle *dbfile, *dbfile_comp;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;

    char keybuf[32], metabuf[32], bodybuf[128];
    // Get the default callbacks which result in normal operation for other ops
    struct anomalous_callbacks *commit_fail_cb = get_default_anon_cbs();
    fail_ctx_t fail_ctx;
    memset(&fail_ctx, 0, sizeof(fail_ctx_t));
    // Modify the fsync callback to redirect to test-specific function
    commit_fail_cb->fsync_cb = &fsync_failure_cb;

    // remove previous anomaly_test files
    r = system(SHELL_DEL" anomaly_test* > errorlog.txt");
    (void)r;

    // Reset anomalous behavior stats..
    filemgr_ops_anomalous_init(commit_fail_cb, &fail_ctx);

    // The number indicates the count after which all commits begin to fail
    // This number is unique to this test suite and can cause a hang
    // if the underlying fixed issue resurfaces
    fail_ctx.start_failing_after = 3;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;

    // open db
    fdb_open(&dbfile, "anomaly_test2", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf)+1,
                       (void*)metabuf, strlen(metabuf)+1,
                       (void*)bodybuf, strlen(bodybuf)+1);
        status = fdb_set(db, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (i == n / 2) {
            status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_open(&dbfile_comp, "anomaly_test2", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Due to anomalous ops this compaction should fail after new file
    // is created and a final commit is attempted..
    status = fdb_compact(dbfile_comp, "anomaly_test3");
    TEST_CHK(status == FDB_RESULT_FSYNC_FAIL);
    fail_ctx.start_failing_after = 99999; // reset this so rollback can proceed

    status = fdb_close(dbfile_comp);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // The above compaction failure should not result in rollback hanging..
    // MB-21953: Rollback hangs infinitely in decaying_usleep due to compaction
    // failure above which does not reset the file status to NORMAL
    status = fdb_rollback(&db, n/2 + 1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    sprintf(bodybuf, "compaction failure hangs rollback test :%d "
                     "failures out of %d commits",
                     fail_ctx.num_fails, fail_ctx.num_ops);

    TEST_RESULT(bodybuf);
}